

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicToricLattice.cpp
# Opt level: O2

void __thiscall RhombicToricLattice::createVertexToEdges(RhombicToricLattice *this)

{
  int iVar1;
  pointer pvVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> *this_00;
  cartesian4 cVar6;
  allocator local_55;
  int local_54;
  string local_50 [32];
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    iVar1 = (this->super_Lattice).l;
    if ((long)(iVar1 * iVar1 * iVar1 * 2) <= (long)uVar4) {
      return;
    }
    cVar6 = Lattice::indexToCoordinate(&this->super_Lattice,(int)uVar4);
    uVar3 = cVar6.z + cVar6.x + cVar6.y;
    if (cVar6._8_8_ >> 0x20 == 0) {
      if ((uVar3 & 1) == 0) {
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xyz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xy",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"yz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xyz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xy",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"yz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        goto LAB_00121707;
      }
    }
    else {
      this_00 = (vector<int,_std::allocator<int>_> *)
                ((long)&(((this->super_Lattice).vertexToEdges.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar5);
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::string(local_50,"xy",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"yz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xyz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
      }
      else {
        std::__cxx11::string::string(local_50,"xy",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"yz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                             (this,uVar4 & 0xffffffff,local_50,0xffffffffffffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
        std::__cxx11::string::~string(local_50);
        pvVar2 = (this->super_Lattice).vertexToEdges.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"xyz",&local_55);
        local_54 = (*(this->super_Lattice)._vptr_Lattice[2])(this,uVar4 & 0xffffffff,local_50,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar5),&local_54);
      }
LAB_00121707:
      std::__cxx11::string::~string(local_50);
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x18;
  } while( true );
}

Assistant:

void RhombicToricLattice::createVertexToEdges()
{
    for (int vertexIndex = 0; vertexIndex < 2 * l * l * l; ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if (coordinate.w == 0)
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 0)
            {
                int sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
            }
        }
        else
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 0)
            {
                int sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
            }
            else
            {
                int sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
            }
        }
    }
}